

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVertexTriangleAdjacency.cpp
# Opt level: O0

void __thiscall
VTAdjacencyTest_smallDataSet_Test::~VTAdjacencyTest_smallDataSet_Test
          (VTAdjacencyTest_smallDataSet_Test *this)

{
  VTAdjacencyTest_smallDataSet_Test *this_local;
  
  VTAdjacencyTest::~VTAdjacencyTest(&this->super_VTAdjacencyTest);
  return;
}

Assistant:

TEST_F(VTAdjacencyTest, smallDataSet)
{

    // build a test mesh - this one is extremely small
    // *******************************************************************************
    aiMesh mesh;

    mesh.mNumVertices = 5;
    mesh.mNumFaces = 3;

    mesh.mFaces = new aiFace[3];
    mesh.mFaces[0].mIndices = new unsigned int[3];
    mesh.mFaces[0].mNumIndices = 3;
    mesh.mFaces[1].mIndices = new unsigned int[3];
    mesh.mFaces[1].mNumIndices = 3;
    mesh.mFaces[2].mIndices = new unsigned int[3];
    mesh.mFaces[2].mNumIndices = 3;

    mesh.mFaces[0].mIndices[0] = 1;
    mesh.mFaces[0].mIndices[1] = 3;
    mesh.mFaces[0].mIndices[2] = 2;

    mesh.mFaces[1].mIndices[0] = 0;
    mesh.mFaces[1].mIndices[1] = 2;
    mesh.mFaces[1].mIndices[2] = 3;

    mesh.mFaces[2].mIndices[0] = 3;
    mesh.mFaces[2].mIndices[1] = 0;
    mesh.mFaces[2].mIndices[2] = 4;

    checkMesh(mesh);
}